

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O0

void test_ADynArray_insertArray_success_negativeIndexGetsMaxIndex_fn(int _i)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uintmax_t _ck_y_4;
  uintmax_t _ck_x_6;
  void *_ck_x_5;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_3;
  char *_ck_x_4;
  void *_ck_x_3;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_2;
  uintmax_t _ck_y_1;
  uintmax_t _ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  private_ACUtilsTest_ADynArray_CharArray array;
  int _i_local;
  
  array.buffer._4_4_ = _i;
  memcpy(&_ck_x,&PTR_private_ACUtilsTest_ADynArray_realloc_001a74d0,0x30);
  array.growStrategy = (ACUtilsGrowStrategy)0x5;
  array.deallocator = private_ACUtilsTest_ADynArray_growStrategy;
  array.size = 8;
  private_ACUtilsTest_ADynArray_reallocFail = false;
  array.capacity = (*(code *)_ck_x)(0,8);
  *(undefined4 *)array.capacity = 0x33323130;
  *(undefined1 *)(array.capacity + 4) = 0x34;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  bVar1 = private_ACUtils_ADynArray_insertArray(&_ck_x,0xffffffffffffffff,"56",3,1);
  if ((ulong)bVar1 != 1) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x388,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "private_ACUtils_ADynArray_insertArray(&array, -1, \"56\\0\", 3, sizeof(*(&array)->buffer)) == true"
                      ,
                      "private_ACUtils_ADynArray_insertArray(&array, -1, \"56\\0\", 3, sizeof(*(&array)->buffer))"
                      ,(ulong)bVar1,"true",1,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x388);
  if (array.growStrategy != (ACUtilsGrowStrategy)0x8) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x389,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","array.size == 8","array.size"
                      ,array.growStrategy,"8",8,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x389);
  if (array.size != 8) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x38a,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","array.capacity == 8",
                      "array.capacity",array.size,"8",8,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x38a);
  if (array.capacity != 0) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x38b);
    _ck_y_s = (char *)array.capacity;
    if (array.capacity == 0) {
      _ck_y_q = "";
      _ck_y_s = "(null)";
    }
    else {
      _ck_y_q = "\"";
      iVar2 = strcmp("0123456",(char *)array.capacity);
      if (iVar2 == 0) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x38c);
        if (array.deallocator == (ACUtilsDeallocator)0x0) {
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x38d,"Assertion \'_ck_x != NULL\' failed",
                            "Assertion \'%s\' failed: %s == %#x",
                            "(void*) array.growStrategy != NULL","(void*) array.growStrategy",0,0);
        }
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x38d);
        if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
          sVar3 = 0x38e;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x38e);
          (*array.reallocator)((void *)array.capacity,sVar3);
          return;
        }
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x38e,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "private_ACUtilsTest_ADynArray_reallocCount == 0",
                          "private_ACUtilsTest_ADynArray_reallocCount",
                          private_ACUtilsTest_ADynArray_reallocCount,"0",0,0);
      }
    }
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x38c,
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                      "array.buffer == \"0123456\"","array.buffer",_ck_y_q,_ck_y_s,_ck_y_q,
                      "\"0123456\"","\"","0123456","\"",0);
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x38b,"Assertion \'_ck_x != NULL\' failed","Assertion \'%s\' failed: %s == %#x"
                    ,"(void*) array.buffer != NULL","(void*) array.buffer",0,0);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_insertArray_success_negativeIndexGetsMaxIndex)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 5;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 8;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    memcpy(array.buffer, "01234", 5);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_insertArray(&array, -1, "56\0", 3), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 8);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "0123456");
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}